

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Ea<(moira::Mode)7,_2> *ea)

{
  Ea<(moira::Mode)7,_2> *ea_local;
  StrWriter *this_local;
  
  operator<<(this,(Aw<(moira::Mode)7,_2>)ea);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Ea<M, S> &ea)
{
    switch (M) {

        case Mode::DN:   *this << Dn{ea.reg};    break;
        case Mode::AN:   *this << An{ea.reg};    break;
        case Mode::AI:   *this << Ai<M,S>{ea};   break;
        case Mode::PI:   *this << Pi<M,S>{ea};   break;
        case Mode::PD:   *this << Pd<M,S>{ea};   break;
        case Mode::DI:   *this << Di<M,S>{ea};   break;
        case Mode::IX:   *this << Ix<M,S>{ea};   break;
        case Mode::AW:   *this << Aw<M,S>{ea};   break;
        case Mode::AL:   *this << Al<M,S>{ea};   break;
        case Mode::DIPC: *this << DiPc<M,S>{ea}; break;
        case Mode::IXPC: *this << Ix<M,S>{ea};   break;
        case Mode::IM:   *this << Im<M,S>{ea};   break;

        default:
            *this << "???";
    }
    return *this;
}